

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O3

FloatFormat * tcu::FloatFormat::nativeDouble(void)

{
  double dVar1;
  double dVar2;
  FloatFormat *in_RDI;
  
  in_RDI->m_minExp = -0x3fe;
  in_RDI->m_maxExp = 0x3ff;
  in_RDI->m_fractionBits = 0x34;
  in_RDI->m_hasSubnormal = YES;
  in_RDI->m_hasInf = YES;
  in_RDI->m_hasNaN = YES;
  in_RDI->m_exactPrecision = true;
  dVar1 = ldexp(1.0,0x3ff);
  dVar2 = ldexp(4503599627370495.0,0x3cb);
  in_RDI->m_maxValue = dVar2 + dVar1;
  return in_RDI;
}

Assistant:

FloatFormat	FloatFormat::nativeDouble (void)
{
	return nativeFormat<double>();
}